

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O3

cali_variant_t cali_variant_unpack(uchar *buf,size_t *inc,_Bool *okptr)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  anon_union_8_7_33918203_for_value aVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  cali_variant_t cVar9;
  
  bVar2 = 0;
  lVar5 = 0;
  uVar6 = 0;
  do {
    bVar1 = buf[lVar5];
    if (-1 < (char)bVar1) goto LAB_00191ded;
    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << (bVar2 & 0x3f);
    lVar5 = lVar5 + 1;
    bVar2 = bVar2 + 7;
  } while (lVar5 != 9);
  bVar1 = buf[9];
  lVar5 = 9;
LAB_00191ded:
  uVar6 = (ulong)(bVar1 & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar6;
  if (((uint)uVar6 & 0xfe) < 10) {
    bVar2 = 0;
    lVar8 = 0;
    uVar7 = 0;
    do {
      bVar1 = buf[lVar8 + lVar5 + 1];
      if (-1 < (char)bVar1) goto LAB_00191e58;
      uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << (bVar2 & 0x3f);
      lVar8 = lVar8 + 1;
      bVar2 = bVar2 + 7;
    } while (lVar8 != 9);
    bVar1 = buf[lVar5 + 10];
    lVar8 = 9;
LAB_00191e58:
    if (inc != (size_t *)0x0) {
      *inc = *inc + lVar5 + lVar8 + 2;
    }
    aVar4.v_uint = (ulong)(bVar1 & 0x7f) << ((char)lVar8 * '\a' & 0x3fU) | uVar7;
    _Var3 = true;
  }
  else {
    _Var3 = false;
    aVar4.v_uint = 0;
    uVar6 = 0;
  }
  if (okptr != (_Bool *)0x0) {
    *okptr = _Var3;
  }
  cVar9.value.v_uint = aVar4.v_uint;
  cVar9.type_and_size = uVar6;
  return cVar9;
}

Assistant:

cali_variant_t cali_variant_unpack(const unsigned char* buf, size_t* inc, bool* okptr)
{
    cali_variant_t v = { 0, { .v_uint = 0 } };
    size_t         p = 0;

    uint64_t ts = vldec_u64(buf, &p);

    if (_EXTRACT_TYPE(ts) > CALI_MAXTYPE) {
        if (okptr)
            *okptr = false;

        return v;
    }

    v.type_and_size = ts;
    v.value.v_uint  = vldec_u64(buf + p, &p);

    if (inc)
        *inc += p;
    if (okptr)
        *okptr = true;

    return v;
}